

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgent.h
# Opt level: O0

void __thiscall
jaegertracing::testutils::MockAgent::
addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
          (MockAgent *this,char (*args) [13],SamplingStrategyResponse *args_1)

{
  allocator local_41;
  string local_40;
  SamplingStrategyResponse *local_20;
  SamplingStrategyResponse *args_local_1;
  char (*args_local) [13];
  MockAgent *this_local;
  
  local_20 = args_1;
  args_local_1 = (SamplingStrategyResponse *)args;
  args_local = (char (*) [13])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,*args,&local_41);
  SamplingManager::addSamplingStrategy((SamplingManager *)(this + 0x168),&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void addSamplingStrategy(Args&&... args)
    {
        _samplingMgr.addSamplingStrategy(std::forward<Args>(args)...);
    }